

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# question_8.cpp
# Opt level: O0

int main(void)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  int local_18;
  int local_14;
  int i;
  int cnt;
  int n;
  
  cnt = 0;
  std::istream::operator>>((istream *)&std::cin,&i);
  num[0] = i;
  local_14 = 1;
  while( true ) {
    bVar1 = judge(i);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    iVar2 = reset(i);
    i = iVar2 + i;
    num[local_14] = i;
    local_14 = local_14 + 1;
  }
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,local_14 + -1);
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  for (local_18 = 0; local_18 < local_14; local_18 = local_18 + 1) {
    if (local_18 == local_14 + -1) {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,num[local_18]);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
    }
    else {
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,num[local_18]);
      std::operator<<(poVar3,"--->");
    }
  }
  return 0;
}

Assistant:

int main()
{
    int n,cnt = 0;  //cnt来记录转换加了多少次
    cin  >> n;
    num[cnt++] = n;     //先把这个数存在num当中
    while (!judge(n))
    {
        n += reset(n);
        num[cnt++] = n;
    }
    cout << cnt -1 <<endl;  //cnt-1,要排除这个数本身，才是转换的次数
    for (int i = 0; i < cnt; ++i) {
        if(i != cnt-1 )
        {
            cout << num[i] << "--->";
        }else
            cout << num[i] <<endl;
    }
    return 0;
}